

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O3

void * memleak_calloc(size_t nmemb,size_t size,char *file,size_t line)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = calloc(nmemb,size);
  if ((pvVar1 != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    puVar2 = (undefined8 *)malloc(0x38);
    *puVar2 = pvVar1;
    puVar2[1] = file;
    puVar2[3] = line;
    puVar2[2] = size;
    avl_insert(&tree_index,(avl_node *)(puVar2 + 4),memleak_cmp);
    pthread_spin_unlock(&lock);
  }
  return pvVar1;
}

Assistant:

LIBMEMLEAK_API
void * memleak_calloc(size_t nmemb, size_t size, char *file, size_t line)
{
    void *addr = (void *)calloc(nmemb, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, 0x0);
        spin_unlock(&lock);
    }

    return addr;
}